

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_rewriter.cpp
# Opt level: O2

void __thiscall
duckdb::ExpressionRewriter::VisitExpression
          (ExpressionRewriter *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expression)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  LogicalOperator *op;
  bool changes_made;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_40;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_38;
  
  do {
    changes_made = false;
    op = optional_ptr<duckdb::LogicalOperator,_true>::operator*(&this->op);
    local_40._M_head_impl =
         (expression->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
         )._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (expression->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    ApplyRules((ExpressionRewriter *)&stack0xffffffffffffffc8,op,&this->to_apply_rules,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_40,&changes_made,true);
    _Var1._M_head_impl =
         (expression->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
         )._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (expression->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = local_38._M_head_impl;
    if (_Var1._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
    if (local_40._M_head_impl != (Expression *)0x0) {
      (*((local_40._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_40._M_head_impl = (Expression *)0x0;
  } while (changes_made != false);
  return;
}

Assistant:

void ExpressionRewriter::VisitExpression(unique_ptr<Expression> *expression) {
	bool changes_made;
	do {
		changes_made = false;
		*expression = ExpressionRewriter::ApplyRules(*op, to_apply_rules, std::move(*expression), changes_made, true);
	} while (changes_made);
}